

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NonMaximumSuppression::SharedDtor(NonMaximumSuppression *this)

{
  bool bVar1;
  string *psVar2;
  NonMaximumSuppression *this_local;
  
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->confidenceinputfeaturename_,psVar2);
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->coordinatesinputfeaturename_,psVar2);
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->iouthresholdinputfeaturename_,psVar2);
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->confidencethresholdinputfeaturename_,psVar2);
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->confidenceoutputfeaturename_,psVar2);
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->coordinatesoutputfeaturename_,psVar2);
  bVar1 = has_SuppressionMethod(this);
  if (bVar1) {
    clear_SuppressionMethod(this);
  }
  bVar1 = has_ClassLabels(this);
  if (bVar1) {
    clear_ClassLabels(this);
  }
  return;
}

Assistant:

void NonMaximumSuppression::SharedDtor() {
  confidenceinputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  coordinatesinputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  iouthresholdinputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  confidencethresholdinputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  confidenceoutputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  coordinatesoutputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (has_SuppressionMethod()) {
    clear_SuppressionMethod();
  }
  if (has_ClassLabels()) {
    clear_ClassLabels();
  }
}